

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_state.cpp
# Opt level: O0

int (anonymous_namespace)::store_bool<int,char>(int *out,char *val)

{
  bool bVar1;
  char *in_RSI;
  char *in_RDI;
  int local_4;
  
  if (in_RSI == (char *)0x0) {
    local_4 = 3;
  }
  else {
    bVar1 = anon_unknown.dwarf_9e99::strmatch(in_RDI,in_RSI);
    if ((!bVar1) && (bVar1 = anon_unknown.dwarf_9e99::strmatch(in_RDI,in_RSI), !bVar1)) {
      bVar1 = anon_unknown.dwarf_9e99::strmatch(in_RDI,in_RSI);
      if ((!bVar1) && (bVar1 = anon_unknown.dwarf_9e99::strmatch(in_RDI,in_RSI), !bVar1)) {
        return 3;
      }
      in_RDI[0] = '\x01';
      in_RDI[1] = '\0';
      in_RDI[2] = '\0';
      in_RDI[3] = '\0';
      return 0;
    }
    in_RDI[0] = '\0';
    in_RDI[1] = '\0';
    in_RDI[2] = '\0';
    in_RDI[3] = '\0';
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int store_bool(INT_T *out, const CHAR_T *val)
{
    static const char* const s_zero  = "0";
    static const char* const s_one   = "1";
    static const char* const s_true  = "true";
    static const char* const s_false = "false";
    
    if (val == 0)
        return __CILKRTS_SET_PARAM_INVALID;

    if (strmatch(s_false, val) || strmatch(s_zero, val)) { 
        *out = 0;
        return __CILKRTS_SET_PARAM_SUCCESS;
    }

    if (strmatch(s_true, val) || strmatch(s_one, val)) { 
        *out = 1;
        return __CILKRTS_SET_PARAM_SUCCESS;
    }

    return __CILKRTS_SET_PARAM_INVALID;
}